

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

uint gl4cts::Utils::getBaseVariableTypeComponentSize(_variable_type type)

{
  uint uVar1;
  TestError *this;
  
  if ((int)type < 0x11) {
    uVar1 = 1;
    if (type != VARIABLE_TYPE_BOOL) {
      if (type != VARIABLE_TYPE_DOUBLE) goto LAB_0091c148;
      uVar1 = 8;
    }
  }
  else {
    if (((type != VARIABLE_TYPE_FLOAT) && (type != VARIABLE_TYPE_INT)) &&
       (type != VARIABLE_TYPE_UINT)) {
LAB_0091c148:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unrecognized variable type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x1c9);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar1 = 4;
  }
  return uVar1;
}

Assistant:

unsigned int Utils::getBaseVariableTypeComponentSize(_variable_type type)
{
	unsigned int result = 0;

	switch (type)
	{
	case VARIABLE_TYPE_BOOL:
		result = sizeof(bool);
		break;
	case VARIABLE_TYPE_DOUBLE:
		result = sizeof(double);
		break;
	case VARIABLE_TYPE_FLOAT:
		result = sizeof(float);
		break;
	case VARIABLE_TYPE_INT:
		result = sizeof(int);
		break;
	case VARIABLE_TYPE_UINT:
		result = sizeof(unsigned int);
		break;

	default:
	{
		TCU_FAIL("Unrecognized variable type");
	}
	} /* switch (type) */

	return result;
}